

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void start_lisp(void)

{
  DLword *pDVar1;
  short sVar2;
  uint uVar3;
  DLword *pDVar4;
  
  uVar3 = *INTERRUPTSTATE_word;
  if ((uVar3 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
  }
  pDVar1 = Lisp_world;
  Lisp_world[(ulong)uVar3 + 1] = Lisp_world[(ulong)uVar3 + 1] & 0x1eff;
  pDVar1[uVar3] = 0;
  MachineState.tosvalue = 0;
  MachineState.errorexit = 0;
  MachineState.pvar = Stackspace + (ulong)InterfacePage->currentfxp + 10;
  pDVar1 = Stackspace + MachineState.pvar[-5];
  pDVar4 = pDVar1;
  if (*(short *)((ulong)pDVar1 ^ 2) == -0x6000) goto LAB_00106b61;
  error("Starting Lisp: Next stack block isn\'t free!");
  sVar2 = *(short *)((ulong)pDVar1 ^ 2);
  while (sVar2 == -0x6000) {
LAB_00106b61:
    pDVar4 = pDVar4 + *(ushort *)((ulong)(pDVar4 + 1) ^ 2);
    MachineState.endofstack = pDVar4;
    sVar2 = *(short *)((ulong)pDVar4 ^ 2);
  }
  MachineState.csp = pDVar1 + -2;
  MachineState.ivar =
       (DLword *)
       ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
  uVar3 = *(uint *)(MachineState.pvar + -8);
  if ((uVar3 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar3);
  }
  MachineState.currentfunc = (fnhead *)(Lisp_world + uVar3);
  MachineState.currentpc =
       (ByteCode *)((long)&(MachineState.currentfunc)->na + (ulong)MachineState.pvar[-6]);
  int_init();
  dispatch();
  return;
}

Assistant:

void start_lisp(void) {
  DLword *freeptr, *next68k;

/*******************************/
/*  First, turn off any pending interrupts from during VMEMSAVE.	*/
/*  This keeps US from trying to handle OLD interrupts.		*/
/*******************************/
#ifndef INIT
  {
    INTSTAT *intstate = ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word));
    intstate->ETHERInterrupt = 0;
    intstate->LogFileIO = 0;
    intstate->IOInterrupt = 0;
    intstate->waitinginterrupt = 0;
    intstate->intcharcode = 0;
  }
#endif /* INIT */

  TopOfStack = 0;
  Error_Exit = 0;

  PVar = NativeAligned2FromStackOffset(InterfacePage->currentfxp) + FRAMESIZE;

  freeptr = next68k = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  if (GETWORD(next68k) != STK_FSB_WORD) error("Starting Lisp: Next stack block isn't free!");

  while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

  CurrentStackPTR = next68k - 2;

  FastRetCALL;

  /* JRB - The interrupt initialization must be done right before  */
  /*       entering the bytecode dispatch loop; interrupts get     */
  /*       unblocked here 					   */
  int_init();
#ifdef DOS
  _dpmi_lockregion((void *)&dispatch, 32768);
#endif /* DOS */
  dispatch();
}